

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

void __thiscall Fossilize::ExternalReplayer::Impl::parse_message(Impl *this,char *msg)

{
  int iVar1;
  long lVar2;
  uint local_124;
  pair<unsigned_int,_unsigned_long> local_120;
  ulonglong local_110;
  Hash compute_pipeline;
  char *pcStack_100;
  int index_2;
  char *end_2;
  pair<unsigned_int,_unsigned_long> local_f0;
  ulonglong local_e0;
  Hash raytrace_pipeline;
  char *pcStack_d0;
  int index_1;
  char *end_1;
  pair<unsigned_int,_unsigned_long> local_c0;
  ulonglong local_b0;
  Hash graphics_pipeline;
  char *pcStack_a0;
  int index;
  char *end;
  ulonglong local_88;
  ulonglong local_80;
  unsigned_long_long hash_3;
  ulonglong local_68;
  ulonglong local_60;
  unsigned_long_long hash_2;
  ulonglong local_48;
  ulonglong local_40;
  unsigned_long_long hash_1;
  ulonglong local_28;
  ulonglong local_20;
  unsigned_long_long hash;
  char *msg_local;
  Impl *this_local;
  
  hash = (unsigned_long_long)msg;
  msg_local = (char *)this;
  iVar1 = strncmp(msg,"MODULE",6);
  if (iVar1 == 0) {
    local_28 = strtoull((char *)(hash + 6),(char **)0x0,0x10);
    local_20 = local_28;
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->faulty_spirv_modules,&local_28);
  }
  else {
    iVar1 = strncmp((char *)hash,"GRAPHICS_VERR",0xd);
    if (iVar1 == 0) {
      local_48 = strtoull((char *)(hash + 0xd),(char **)0x0,0x10);
      local_40 = local_48;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::insert(&this->graphics_failed_validation,&local_48);
    }
    else {
      iVar1 = strncmp((char *)hash,"COMPUTE_VERR",0xc);
      if (iVar1 == 0) {
        local_68 = strtoull((char *)(hash + 0xc),(char **)0x0,0x10);
        local_60 = local_68;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::insert(&this->compute_failed_validation,&local_68);
      }
      else {
        iVar1 = strncmp((char *)hash,"RAYTRACE_VERR",0xd);
        if (iVar1 == 0) {
          local_88 = strtoull((char *)(hash + 0xd),(char **)0x0,0x10);
          local_80 = local_88;
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::insert(&this->raytracing_failed_validation,&local_88);
        }
        else {
          iVar1 = strncmp((char *)hash,"GRAPHICS",8);
          if (iVar1 == 0) {
            pcStack_a0 = (char *)0x0;
            lVar2 = strtol((char *)(hash + 8),&stack0xffffffffffffff60,0);
            graphics_pipeline._4_4_ = (int)lVar2;
            if ((-1 < graphics_pipeline._4_4_) && (pcStack_a0 != (char *)0x0)) {
              local_b0 = strtoull(pcStack_a0,(char **)0x0,0x10);
              end_1._4_4_ = graphics_pipeline._4_4_;
              std::pair<unsigned_int,_unsigned_long>::pair<unsigned_int,_unsigned_long_&,_true>
                        (&local_c0,(uint *)((long)&end_1 + 4),&local_b0);
              std::
              vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              ::push_back(&this->faulty_graphics_pipelines,&local_c0);
            }
          }
          else {
            iVar1 = strncmp((char *)hash,"RAYTRACE",8);
            if (iVar1 == 0) {
              pcStack_d0 = (char *)0x0;
              lVar2 = strtol((char *)(hash + 8),&stack0xffffffffffffff30,0);
              raytrace_pipeline._4_4_ = (int)lVar2;
              if ((-1 < raytrace_pipeline._4_4_) && (pcStack_d0 != (char *)0x0)) {
                local_e0 = strtoull(pcStack_d0,(char **)0x0,0x10);
                end_2._4_4_ = raytrace_pipeline._4_4_;
                std::pair<unsigned_int,_unsigned_long>::pair<unsigned_int,_unsigned_long_&,_true>
                          (&local_f0,(uint *)((long)&end_2 + 4),&local_e0);
                std::
                vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                ::push_back(&this->faulty_raytracing_pipelines,&local_f0);
              }
            }
            else {
              iVar1 = strncmp((char *)hash,"COMPUTE",7);
              if (iVar1 == 0) {
                pcStack_100 = (char *)0x0;
                lVar2 = strtol((char *)(hash + 7),&stack0xffffffffffffff00,0);
                compute_pipeline._4_4_ = (uint)lVar2;
                if ((-1 < (int)compute_pipeline._4_4_) && (pcStack_100 != (char *)0x0)) {
                  local_110 = strtoull(pcStack_100,(char **)0x0,0x10);
                  local_124 = compute_pipeline._4_4_;
                  std::pair<unsigned_int,_unsigned_long>::pair<unsigned_int,_unsigned_long_&,_true>
                            (&local_120,&local_124,&local_110);
                  std::
                  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  ::push_back(&this->faulty_compute_pipelines,&local_120);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ExternalReplayer::Impl::parse_message(const char *msg)
{
	if (strncmp(msg, "MODULE", 6) == 0)
	{
		auto hash = strtoull(msg + 6, nullptr, 16);
		faulty_spirv_modules.insert(hash);
	}
	else if (strncmp(msg, "GRAPHICS_VERR", 13) == 0)
	{
		auto hash = strtoull(msg + 13, nullptr, 16);
		graphics_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "COMPUTE_VERR", 12) == 0)
	{
		auto hash = strtoull(msg + 12, nullptr, 16);
		compute_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "RAYTRACE_VERR", 13) == 0)
	{
		auto hash = strtoull(msg + 13, nullptr, 16);
		raytracing_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "GRAPHICS", 8) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 8, &end, 0));
		if (index >= 0 && end)
		{
			Hash graphics_pipeline = strtoull(end, nullptr, 16);
			faulty_graphics_pipelines.push_back({ unsigned(index), graphics_pipeline });
		}
	}
	else if (strncmp(msg, "RAYTRACE", 8) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 8, &end, 0));
		if (index >= 0 && end)
		{
			Hash raytrace_pipeline = strtoull(end, nullptr, 16);
			faulty_raytracing_pipelines.push_back({ unsigned(index), raytrace_pipeline });
		}
	}
	else if (strncmp(msg, "COMPUTE", 7) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 7, &end, 0));
		if (index >= 0 && end)
		{
			Hash compute_pipeline = strtoull(end, nullptr, 16);
			faulty_compute_pipelines.push_back({ unsigned(index), compute_pipeline });
		}
	}
}